

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spscqueue.cpp
# Opt level: O3

int write_proc(void)

{
  bool bVar1;
  int iVar2;
  node *pnVar3;
  uint uVar4;
  
  if (g_index <= g_maxCount) {
    uVar4 = 0x32;
    do {
      do {
        iVar2 = g_index;
        g_index = g_index + 1;
        pnVar3 = spsc_queue<int>::alloc_node(&q);
        pnVar3->next_ = (node *)0x0;
        pnVar3->value_ = iVar2;
        (q.head_)->next_ = pnVar3;
        bVar1 = 1 < uVar4;
        uVar4 = uVar4 - 1;
        q.head_ = pnVar3;
      } while (bVar1);
      usleep(1);
      uVar4 = 0x32;
    } while (g_index <= g_maxCount);
  }
  return 0;
}

Assistant:

int write_proc()
{

    while( g_index <= g_maxCount)
    {
	int step = rand_step(); 
	Log( " enqueue "<< step<< " to queue " ); 
	while(step  > 0)
	{
	    step--; 

	    {
		q.enqueue(g_index++); 
	    }
	}
	usleep(1); 
    }
    Log(" write finished " ); 

    return 0; 

}